

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int lyp_check_length_range(ly_ctx *ctx,char *expr,lys_type *type)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  ushort *puVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  char *local_48;
  char *tail;
  len_ran_intv *intv;
  
  tail = (char *)0x0;
  if (expr == (char *)0x0) {
    __assert_fail("expr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x2c4,
                  "int lyp_check_length_range(struct ly_ctx *, const char *, struct lys_type *)");
  }
  ppuVar3 = __ctype_b_loc();
  puVar4 = *ppuVar3;
  intv._0_4_ = 1;
  pcVar5 = expr;
  intv._4_4_ = (uint)intv;
LAB_00122473:
  pcVar5 = pcVar5 + 2;
  do {
    pcVar6 = pcVar5;
    cVar1 = pcVar6[-2];
    pcVar5 = pcVar6 + 1;
  } while ((puVar4[cVar1] >> 0xd & 1) != 0);
  pcVar5 = pcVar6 + -2;
  if (cVar1 != 'm') {
LAB_001224c1:
    if ((((puVar4[cVar1] >> 0xb & 1) != 0) || ((cVar1 == '-' || (cVar1 == '+')))) &&
       (check_number(pcVar5,&local_48,type->base), pcVar5 != local_48)) goto code_r0x001224f0;
    goto LAB_00122622;
  }
  cVar7 = pcVar6[-1];
  if (cVar7 == 'a') {
    if (*pcVar6 != 'x') {
      cVar7 = pcVar6[-1];
      goto LAB_001224b1;
    }
    goto LAB_001225ea;
  }
LAB_001224b1:
  if ((cVar7 != 'i') || (*pcVar6 != 'n')) goto LAB_001224c1;
  if (intv._4_4_ == 0) goto LAB_00122622;
  do {
    pcVar5 = pcVar6;
    cVar1 = pcVar5[1];
    pcVar6 = pcVar5 + 1;
  } while ((*(byte *)((long)puVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  if (cVar1 == '.') {
    intv._4_4_ = 0;
    if (pcVar5[2] == '.') goto LAB_00122526;
    goto LAB_00122622;
  }
  if (cVar1 == '|') {
    intv._4_4_ = 0;
    goto LAB_00122597;
  }
  goto joined_r0x001225fe;
code_r0x001224f0:
  puVar4 = *ppuVar3;
  pcVar5 = local_48;
  do {
    pcVar6 = pcVar5;
    cVar1 = *pcVar6;
    pcVar5 = pcVar6 + 1;
  } while ((*(byte *)((long)puVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  if (cVar1 != '|') {
    if ((cVar1 != '.') || (*pcVar5 != '.')) goto LAB_00122600;
LAB_00122526:
    pcVar5 = pcVar6 + 1;
    do {
      pcVar6 = pcVar5;
      cVar1 = pcVar6[1];
      pcVar5 = pcVar6 + 1;
    } while ((*(byte *)((long)puVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    if (cVar1 == 'm') {
      if ((pcVar6[2] == 'a') && (pcVar6[3] == 'x')) {
LAB_001225ea:
        pcVar5 = pcVar5 + 3;
        do {
          cVar1 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while ((*(byte *)((long)puVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
joined_r0x001225fe:
        if (cVar1 == '\0') {
LAB_00122600:
          iVar2 = resolve_len_ran_interval(ctx,expr,type,(len_ran_intv **)&tail);
          intv._0_4_ = (uint)(iVar2 != 0);
        }
LAB_00122622:
        while (tail != (char *)0x0) {
          pcVar5 = *(char **)(tail + 0x20);
          free(tail);
          tail = pcVar5;
        }
        return (uint)intv;
      }
    }
    else if (cVar1 == '\0') goto LAB_00122622;
    check_number(pcVar5,&local_48,type->base);
    if (pcVar5 == local_48) goto LAB_00122622;
    puVar4 = *ppuVar3;
    pcVar6 = local_48 + -1;
    do {
      cVar1 = pcVar6[1];
      pcVar6 = pcVar6 + 1;
    } while ((*(byte *)((long)puVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    if (cVar1 != '|') goto joined_r0x001225fe;
LAB_00122597:
    pcVar5 = pcVar6 + 1;
  }
  goto LAB_00122473;
}

Assistant:

int
lyp_check_length_range(struct ly_ctx *ctx, const char *expr, struct lys_type *type)
{
    struct len_ran_intv *intv = NULL, *tmp_intv;
    const char *c = expr, *tail;
    int ret = EXIT_FAILURE, flg = 1; /* first run flag */

    assert(expr);

lengthpart:

    while (isspace(*c)) {
        c++;
    }

    /* lower boundary or explicit number */
    if (!strncmp(c, "max", 3)) {
max:
        c += 3;
        while (isspace(*c)) {
            c++;
        }
        if (*c != '\0') {
            goto error;
        }

        goto syntax_ok;

    } else if (!strncmp(c, "min", 3)) {
        if (!flg) {
            /* min cannot be used elsewhere than in the first length-part */
            goto error;
        } else {
            flg = 0;
        }
        c += 3;
        while (isspace(*c)) {
            c++;
        }

        if (*c == '|') {
            c++;
            /* process next length-part */
            goto lengthpart;
        } else if (*c == '\0') {
            goto syntax_ok;
        } else if (!strncmp(c, "..", 2)) {
upper:
            c += 2;
            while (isspace(*c)) {
                c++;
            }
            if (*c == '\0') {
                goto error;
            }

            /* upper boundary */
            if (!strncmp(c, "max", 3)) {
                goto max;
            }

            check_number(c, &tail, type->base);
            if (c == tail) {
                goto error;
            }
            c = tail;
            while (isspace(*c)) {
                c++;
            }
            if (*c == '\0') {
                goto syntax_ok;
            } else if (*c == '|') {
                c++;
                /* process next length-part */
                goto lengthpart;
            } else {
                goto error;
            }
        } else {
            goto error;
        }

    } else if (isdigit(*c) || (*c == '-') || (*c == '+')) {
        /* number */
        check_number(c, &tail, type->base);
        if (c == tail) {
            goto error;
        }
        c = tail;

        while (isspace(*c)) {
            c++;
        }

        if (*c == '|') {
            c++;
            /* process next length-part */
            goto lengthpart;
        } else if (*c == '\0') {
            goto syntax_ok;
        } else if (!strncmp(c, "..", 2)) {
            goto upper;
        }

    } else {
        goto error;
    }

syntax_ok:
    if (resolve_len_ran_interval(ctx, expr, type, &intv)) {
        goto error;
    }

    ret = EXIT_SUCCESS;

error:
    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }

    return ret;
}